

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void sect_EndLoadSection(void)

{
  if (currentLoadSection != (Section *)0x0) {
    changeSection();
    curOffset = curOffset + loadOffset;
    loadOffset = 0;
    currentLoadSection = (Section *)0x0;
    sym_SetCurrentSymbolScope(currentLoadScope);
    return;
  }
  error("Found `ENDL` outside of a `LOAD` block\n");
  return;
}

Assistant:

void sect_EndLoadSection(void)
{
	if (!currentLoadSection) {
		error("Found `ENDL` outside of a `LOAD` block\n");
		return;
	}

	changeSection();
	curOffset += loadOffset;
	loadOffset = 0;
	currentLoadSection = NULL;
	sym_SetCurrentSymbolScope(currentLoadScope);
}